

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O0

int AF_A_MinotaurRoam(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *target;
  int iVar1;
  uint uVar2;
  bool bVar3;
  VMValue *local_c8;
  bool local_b2;
  bool local_af;
  undefined1 local_98 [8];
  VMValue params [3];
  AActor *local_58;
  AMinotaurFriend *self1;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                  ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_af = true;
    if (stateowner != (AActor *)0x0) {
      local_af = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_af == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                    ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x1bd,
                      "int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_b2 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_b2 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_b2 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x1bd,
                      "int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                      ,0x1bd,
                      "int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      self1 = (AMinotaurFriend *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      self1 = (AMinotaurFriend *)0x0;
    }
    FRenderStyle::operator=((FRenderStyle *)&(stateowner->RenderStyle).field_0,STYLE_Normal);
    bVar3 = DObject::IsKindOf((DObject *)stateowner,AMinotaurFriend::RegistrationInfo.MyClass);
    target = stateowner;
    if (((bVar3) && (local_58 = stateowner, -1 < *(int *)&stateowner->field_0x49c)) &&
       (0x36a < level.maptime - *(int *)&stateowner->field_0x49c)) {
      FName::FName((FName *)&stack0xffffffffffffffa4,NAME_None);
      TAngle<double>::TAngle((TAngle<double> *)((long)&params[2].field_0 + 8),0.0);
      P_DamageMobj(target,(AActor *)0x0,(AActor *)0x0,1000000,(FName *)&stack0xffffffffffffffa4,0,
                   (DAngle *)((long)&params[2].field_0 + 8));
    }
    else {
      iVar1 = FRandom::operator()(&pr_minotaurroam);
      if (iVar1 < 0x1e) {
        VMValue::VMValue((VMValue *)local_98,(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)stateowner);
        VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
        VMFrameStack::Call((VMFrameStack *)param_local,&A_MinotaurLook_VMPtr->super_VMFunction,
                           (VMValue *)local_98,3,(VMReturn *)0x0,0,(VMException **)0x0);
        local_c8 = (VMValue *)((long)&params[2].field_0 + 8);
        do {
          local_c8 = local_c8 + -1;
          VMValue::~VMValue(local_c8);
        } while (local_c8 != (VMValue *)local_98);
      }
      iVar1 = FRandom::operator()(&pr_minotaurroam);
      if (iVar1 < 6) {
        iVar1 = FRandom::operator()(&pr_minotaurroam);
        stateowner->movedir = (BYTE)(iVar1 % 8);
        FaceMovementDirection(stateowner);
      }
      bVar3 = P_Move(stateowner);
      if (!bVar3) {
        uVar2 = FRandom::operator()(&pr_minotaurroam);
        if ((uVar2 & 1) == 0) {
          stateowner->movedir = (BYTE)((ulong)(stateowner->movedir + 7) % 8);
        }
        else {
          stateowner->movedir = (BYTE)((ulong)(stateowner->movedir + 1) % 8);
        }
        FaceMovementDirection(stateowner);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x1bd,"int AF_A_MinotaurRoam(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurRoam)
{
	PARAM_ACTION_PROLOGUE;

	// In case pain caused him to skip his fade in.
	self->RenderStyle = STYLE_Normal;

	if (self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

		if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
		{
			P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
			return 0;
		}
	}

	if (pr_minotaurroam() < 30)
		CALL_ACTION(A_MinotaurLook, self);		// adjust to closest target

	if (pr_minotaurroam() < 6)
	{
		//Choose new direction
		self->movedir = pr_minotaurroam() % 8;
		FaceMovementDirection (self);
	}
	if (!P_Move(self))
	{
		// Turn
		if (pr_minotaurroam() & 1)
			self->movedir = (self->movedir + 1) % 8;
		else
			self->movedir = (self->movedir + 7) % 8;
		FaceMovementDirection (self);
	}
	return 0;
}